

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Option *this;
  ostream *poVar1;
  arguments local_8a8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_828;
  arguments local_810;
  string local_790;
  undefined1 local_770 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image_path;
  ParseError *e;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3d1;
  string local_3d0;
  undefined1 local_3b0 [8];
  App app;
  arguments args;
  char **argv_local;
  int argc_local;
  
  args._120_8_ = argv;
  arguments::arguments
            (&app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"CLI to create timelapse video",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_409);
  CLI::App::App((App *)local_3b0,&local_3d0,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"-s,--source",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"source directory containing frames",&local_459);
  this = CLI::App::
         add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                   ((App *)local_3b0,&local_430,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &app.config_formatter_.
                     super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    &local_458,false);
  CLI::OptionBase<CLI::Option>::required(&this->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"-o, --output",&local_481)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a8,"output file name [default: output.avi]",&local_4a9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_480,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&args.source_dir.field_2 + 8),&local_4a8,false);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"-f,--frames",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"frames for making video [default: 25]",&local_4f9);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_4d0,(int *)(args.output_file_name.field_2._M_local_buf + 8),
             &local_4f8,false);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"-z,--filter",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"Name to filter to be applied to each frame",&local_549);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_520,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args.frames,
             &local_548,false);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"-v,--value",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"Value of the filter provided in -z/--filter option",&local_599);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_570,(int *)(args.filter_name.field_2._M_local_buf + 8),
             &local_598,false);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"-B,--brightness",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Value of brightness to applied to images [default: 0]",&local_5e9
            );
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_5c0,(float *)((long)&args.filter_name.field_2 + 0xc),&local_5e8
             ,false);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"-S,--sharpness",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"Value of sharpness to be applied to the images [default: 1]",
             &local_639);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_610,&args.brightness_value,&local_638,false);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"-L,--blur",&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"Value of blur to be applied to the images [defauly: 1]",
             &local_689);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_660,&args.contrast_value,&local_688,false);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"-T,--contrast",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"Value of Contrast to be applied to the images [default: 1]",
             &local_6d9);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_6b0,(float *)&args.filter_value,&local_6d8,false);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_700,"-I,--saturation",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Value of saturation to be applied to the images [default: 1]",
             (allocator<char> *)((long)&e + 7));
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            ((App *)local_3b0,&local_700,&args.sharpness_value,&local_728,false);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  CLI::App::parse((App *)local_3b0,argc,(char **)args._120_8_);
  std::operator<<((ostream *)&std::cout,(string *)&banner_abi_cxx11_);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&image_list.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_770);
  std::__cxx11::string::string
            ((string *)&local_790,
             (string *)
             &app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  read_images(&local_790,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_770);
  std::__cxx11::string::~string((string *)&local_790);
  arguments::arguments
            (&local_810,
             (arguments *)
             &app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  apply_filter((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_770,&local_810,
               (char **)args._120_8_,argc);
  arguments::~arguments(&local_810);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            (&local_828,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_770);
  arguments::arguments
            (&local_8a8,
             (arguments *)
             &app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  make_timelapse(&local_828,&local_8a8);
  arguments::~arguments(&local_8a8);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_828);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"\nFinished : Timelapse Ready");
  poVar1 = std::operator<<(poVar1,(string *)color::reset_abi_cxx11_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_770);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&image_list.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  CLI::App::~App((App *)local_3b0);
  arguments::~arguments
            (&app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   // CLI logic
   arguments args;
   CLI::App app{"CLI to create timelapse video"};
   // CLI options
   app.add_option("-s,--source", args.source_dir, "source directory containing frames")->required();
   app.add_option("-o, --output", args.output_file_name, "output file name [default: output.avi]");
   app.add_option("-f,--frames", args.frames, "frames for making video [default: 25]");
   app.add_option("-z,--filter", args.filter_name, "Name to filter to be applied to each frame");
   app.add_option("-v,--value", args.filter_value, "Value of the filter provided in -z/--filter option");
   app.add_option("-B,--brightness", args.brightness_value, "Value of brightness to applied to images [default: 0]");
   app.add_option("-S,--sharpness",args.sharpness_value, "Value of sharpness to be applied to the images [default: 1]");
   app.add_option("-L,--blur", args.blur_value, "Value of blur to be applied to the images [defauly: 1]");
   app.add_option("-T,--contrast", args.contrast_value, "Value of Contrast to be applied to the images [default: 1]");
   app.add_option("-I,--saturation", args.saturation_value, "Value of saturation to be applied to the images [default: 1]");
   CLI11_PARSE(app, argc, argv);
   std::cout << banner;
   std::cout << endl;

   // application logic
   std::vector<std::string> image_path;
   std::vector<cv::Mat> image_list;

   //read image in a vector
   read_images(args.source_dir, image_list);
   // apply filter parameter
   apply_filter(image_list, args, argv, argc);
   // convert collected image to video
   make_timelapse(image_list, args);

   cout << color::green << "\nFinished : Timelapse Ready" << color::reset << std::endl;

   return 0;
}